

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool __thiscall
libaom_examples::anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
          (ParsedValue *this,int64_t min,int64_t max,int line_idx,uchar *v)

{
  undefined4 in_register_0000000c;
  bool bVar1;
  char *__format;
  undefined1 *in_R9;
  
  if ((int)this == 1) {
    if ((min < max) || (CONCAT44(in_register_0000000c,line_idx) < min)) {
      bVar1 = false;
      fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n");
    }
    else {
      *in_R9 = (char)min;
      bVar1 = true;
    }
  }
  else {
    if ((int)this == 2) {
      __format = "Floating point value found where integer was expected at line %d\n";
    }
    else {
      __format = "No value found where integer was expected at line %d\n";
    }
    bVar1 = false;
    fprintf(_stderr,__format,(ulong)v & 0xffffffff);
  }
  return bVar1;
}

Assistant:

bool IntegerValueInRange(int64_t min, int64_t max, int line_idx, T *v) {
    switch (type_) {
      case Type::kInteger:
        if (int_value_ < min || int_value_ > max) {
          fprintf(stderr,
                  "Integer value %" PRId64 " out of range [%" PRId64
                  ", %" PRId64 "] at line %d\n",
                  int_value_, min, max, line_idx);
          return false;
        }
        *v = static_cast<T>(int_value_);
        return true;
      case Type::kFloatingPoint:
        fprintf(stderr,
                "Floating point value found where integer was expected at line "
                "%d\n",
                line_idx);
        return false;
      case Type::kNone:
      default:
        fprintf(stderr,
                "No value found where integer was expected at line %d\n",
                line_idx);
        return false;
    }
  }